

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O3

err_t bakeKDF(octet *key,octet *secret,size_t secret_len,octet *iv,size_t iv_len,size_t num)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  blob_t state;
  octet *level;
  err_t eVar4;
  size_t local_38;
  
  local_38 = num;
  bVar1 = memIsValid(secret,secret_len);
  eVar4 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(iv,iv_len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,0x20);
      if (bVar1 != 0) {
        eVar4 = 0;
        sVar2 = beltHash_keep();
        sVar3 = beltKRP_keep();
        sVar2 = utilMax(2,sVar2,sVar3 + 0x10);
        state = blobCreate(sVar2);
        if (state == (blob_t)0x0) {
          eVar4 = 0x6e;
        }
        else {
          sVar2 = beltKRP_keep();
          level = (octet *)(sVar2 + (long)state);
          beltHashStart(state);
          beltHashStepH(secret,secret_len,state);
          beltHashStepH(iv,iv_len,state);
          beltHashStepG(key,state);
          memSet(level,0xff,0xc);
          beltKRPStart(state,key,0x20,level);
          memCopy(level,&local_38,8);
          memSet((void *)((long)state + sVar2 + 8),'\0',8);
          beltKRPStepG(key,0x20,level,state);
          blobClose(state);
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t bakeKDF(octet key[32], const octet secret[], size_t secret_len, 
	const octet iv[], size_t iv_len, size_t num)
{
	void* state;
	octet* block;
	// проверить входные данные
	if (!memIsValid(secret, secret_len) ||
		!memIsValid(iv, iv_len) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(utilMax(2, beltHash_keep(), beltKRP_keep() + 16));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	block = (octet*)state + beltKRP_keep();
	// key <- beltHash(secret || iv)
	beltHashStart(state);
	beltHashStepH(secret, secret_len, state);
	beltHashStepH(iv, iv_len, state);
	beltHashStepG(key, state);
	// key <- beltKRP(Y, 1^96, num)
	memSet(block, 0xFF, 12);
	beltKRPStart(state, key, 32, block);
	CASSERT(B_PER_S <= 128);
	memCopy(block, &num, sizeof(size_t));
#if (OCTET_ORDER == BIG_ENDIAN)
	memRev(block, sizeof(size_t));
#endif
	memSetZero(block + sizeof(size_t), 16 - sizeof(size_t));
	beltKRPStepG(key, 32, block, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}